

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Button.cxx
# Opt level: O3

Fl_Menu_Item * __thiscall Fl_Menu_Button::popup(Fl_Menu_Button *this)

{
  Fl_Widget *in_RAX;
  Fl_Menu_Item *pFVar1;
  Fl_Widget_Tracker mb;
  
  pressed_menu_button_ = this;
  mb.wp_ = in_RAX;
  Fl_Widget::redraw((Fl_Widget *)this);
  Fl_Widget_Tracker::Fl_Widget_Tracker(&mb,(Fl_Widget *)this);
  pFVar1 = (this->super_Fl_Menu_).menu_;
  if (((this->super_Fl_Menu_).super_Fl_Widget.box_ == '\0') ||
     ((this->super_Fl_Menu_).super_Fl_Widget.type_ != '\0')) {
    pFVar1 = Fl_Menu_Item::popup(pFVar1,Fl::e_x,Fl::e_y,
                                 (this->super_Fl_Menu_).super_Fl_Widget.label_.value,
                                 (this->super_Fl_Menu_).value_,&this->super_Fl_Menu_);
  }
  else {
    pFVar1 = Fl_Menu_Item::pulldown
                       (pFVar1,(this->super_Fl_Menu_).super_Fl_Widget.x_,
                        (this->super_Fl_Menu_).super_Fl_Widget.y_,
                        (this->super_Fl_Menu_).super_Fl_Widget.w_,
                        (this->super_Fl_Menu_).super_Fl_Widget.h_,(Fl_Menu_Item *)0x0,
                        &this->super_Fl_Menu_,(Fl_Menu_Item *)0x0,0);
  }
  Fl_Menu_::picked(&this->super_Fl_Menu_,pFVar1);
  pressed_menu_button_ = (Fl_Menu_Button *)0x0;
  if (mb.wp_ != (Fl_Widget *)0x0) {
    Fl_Widget::redraw((Fl_Widget *)this);
  }
  Fl_Widget_Tracker::~Fl_Widget_Tracker(&mb);
  return pFVar1;
}

Assistant:

const Fl_Menu_Item* Fl_Menu_Button::popup() {
  const Fl_Menu_Item* m;
  pressed_menu_button_ = this;
  redraw();
  Fl_Widget_Tracker mb(this);
  if (!box() || type()) {
    m = menu()->popup(Fl::event_x(), Fl::event_y(), label(), mvalue(), this);
  } else {
    m = menu()->pulldown(x(), y(), w(), h(), 0, this);
  }
  picked(m);
  pressed_menu_button_ = 0;
  if (mb.exists()) redraw();
  return m;
}